

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckedint_impl.h
# Opt level: O1

bool __thiscall QRect::contains(QRect *this,QRect *r,bool proper)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  
  iVar5 = (this->x1).m_i;
  iVar15 = (this->y1).m_i;
  iVar1 = iVar5 + -1;
  iVar2 = iVar15 + -1;
  iVar6 = (this->x2).m_i;
  iVar7 = (this->y2).m_i;
  if (iVar7 != iVar2 || iVar6 != iVar1) {
    iVar8 = (r->x1).m_i;
    iVar9 = (r->y1).m_i;
    iVar3 = iVar8 + -1;
    iVar4 = iVar9 + -1;
    iVar10 = (r->x2).m_i;
    iVar11 = (r->y2).m_i;
    if (iVar11 != iVar4 || iVar10 != iVar3) {
      iVar14 = iVar1;
      if (iVar1 < iVar6) {
        iVar14 = iVar6;
      }
      if (iVar6 < iVar1) {
        iVar5 = iVar6 + 1;
      }
      iVar1 = iVar3;
      if (iVar3 < iVar10) {
        iVar1 = iVar10;
      }
      if (iVar10 < iVar3) {
        iVar8 = iVar10 + 1;
      }
      if (proper) {
        bVar13 = iVar8 <= iVar5;
        bVar12 = iVar14 <= iVar1;
      }
      else {
        bVar13 = iVar8 < iVar5;
        bVar12 = iVar14 < iVar1;
      }
      if (!(bool)(bVar12 | bVar13)) {
        if (iVar7 < iVar2) {
          iVar15 = iVar7 + 1;
        }
        if (iVar2 < iVar7) {
          iVar2 = iVar7;
        }
        if (iVar11 < iVar4) {
          iVar9 = iVar11 + 1;
        }
        if (iVar4 < iVar11) {
          iVar4 = iVar11;
        }
        if (proper) {
          bVar13 = iVar9 <= iVar15;
          bVar12 = iVar2 <= iVar4;
        }
        else {
          bVar13 = iVar9 < iVar15;
          bVar12 = iVar2 < iVar4;
        }
        if (!bVar12 && !bVar13) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

Q_DECLARE_STRONGLY_ORDERED_LITERAL_TYPE(
        QCheckedInt,
        AInt,
        template <typename AInt, if_is_same_int<AInt> = true>)
};

template <typename Int, typename I, typename P>
Q_DECL_CONST_FUNCTION size_t constexpr inline qHash(QCheckedInt<Int, I, P> key, size_t seed = 0) noexcept
{
    using QT_PREPEND_NAMESPACE(qHash);
    return qHash(key.value(), seed);
}